

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int nonce_function_rfc6979
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16,void *data,uint counter)

{
  uint local_f4;
  undefined1 local_f0 [4];
  uint i;
  secp256k1_rfc6979_hmac_sha256_t rng;
  int keylen;
  uchar keydata [112];
  uint counter_local;
  void *data_local;
  uchar *algo16_local;
  uchar *key32_local;
  uchar *msg32_local;
  uchar *nonce32_local;
  
  rng.k[0x1c] = '@';
  rng.k[0x1d] = '\0';
  rng.k[0x1e] = '\0';
  rng.k[0x1f] = '\0';
  unique0x00012000 = *(undefined8 *)key32;
  keydata._0_8_ = *(undefined8 *)(key32 + 8);
  keydata._8_8_ = *(undefined8 *)(key32 + 0x10);
  keydata._16_8_ = *(undefined8 *)(key32 + 0x18);
  keydata._24_8_ = *(undefined8 *)msg32;
  keydata._32_8_ = *(undefined8 *)(msg32 + 8);
  keydata._40_8_ = *(undefined8 *)(msg32 + 0x10);
  keydata._48_8_ = *(undefined8 *)(msg32 + 0x18);
  if (data != (void *)0x0) {
    keydata._56_8_ = *data;
    keydata._64_8_ = *(undefined8 *)((long)data + 8);
    keydata._72_8_ = *(undefined8 *)((long)data + 0x10);
    keydata._80_8_ = *(undefined8 *)((long)data + 0x18);
    rng.k[0x1c] = '`';
    rng.k[0x1d] = '\0';
    rng.k[0x1e] = '\0';
    rng.k[0x1f] = '\0';
  }
  keydata._108_4_ = counter;
  if (algo16 != (uchar *)0x0) {
    *(undefined8 *)(rng.k + (long)(int)rng.k._28_4_ + 0x20) = *(undefined8 *)algo16;
    *(undefined8 *)(keydata + (int)rng.k._28_4_) = *(undefined8 *)(algo16 + 8);
    rng.k._28_4_ = rng.k._28_4_ + 0x10;
  }
  secp256k1_rfc6979_hmac_sha256_initialize
            ((secp256k1_rfc6979_hmac_sha256_t *)local_f0,(uchar *)&rng.retry,(long)(int)rng.k._28_4_
            );
  memset(&rng.retry,0,0x70);
  for (local_f4 = 0; local_f4 <= (uint)keydata._108_4_; local_f4 = local_f4 + 1) {
    secp256k1_rfc6979_hmac_sha256_generate((secp256k1_rfc6979_hmac_sha256_t *)local_f0,nonce32,0x20)
    ;
  }
  secp256k1_rfc6979_hmac_sha256_finalize((secp256k1_rfc6979_hmac_sha256_t *)local_f0);
  return 1;
}

Assistant:

static int nonce_function_rfc6979(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *algo16, void *data, unsigned int counter) {
   unsigned char keydata[112];
   int keylen = 64;
   secp256k1_rfc6979_hmac_sha256_t rng;
   unsigned int i;
   /* We feed a byte array to the PRNG as input, consisting of:
    * - the private key (32 bytes) and message (32 bytes), see RFC 6979 3.2d.
    * - optionally 32 extra bytes of data, see RFC 6979 3.6 Additional Data.
    * - optionally 16 extra bytes with the algorithm name.
    * Because the arguments have distinct fixed lengths it is not possible for
    *  different argument mixtures to emulate each other and result in the same
    *  nonces.
    */
   memcpy(keydata, key32, 32);
   memcpy(keydata + 32, msg32, 32);
   if (data != NULL) {
       memcpy(keydata + 64, data, 32);
       keylen = 96;
   }
   if (algo16 != NULL) {
       memcpy(keydata + keylen, algo16, 16);
       keylen += 16;
   }
   secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, keylen);
   memset(keydata, 0, sizeof(keydata));
   for (i = 0; i <= counter; i++) {
       secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
   }
   secp256k1_rfc6979_hmac_sha256_finalize(&rng);
   return 1;
}